

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O3

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_args::test_method
          (chainstatemanager_args *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  undefined1 *puVar3;
  allocator_type *paVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  const_string file;
  const_string file_00;
  initializer_list<const_char_*> __l;
  const_string file_01;
  initializer_list<const_char_*> __l_00;
  const_string file_02;
  initializer_list<const_char_*> __l_01;
  const_string file_03;
  initializer_list<const_char_*> __l_02;
  const_string file_04;
  initializer_list<const_char_*> __l_03;
  const_string file_05;
  initializer_list<const_char_*> __l_04;
  const_string file_06;
  initializer_list<const_char_*> __l_05;
  const_string file_07;
  const_string file_08;
  initializer_list<const_char_*> __l_06;
  const_string file_09;
  initializer_list<const_char_*> __l_07;
  const_string file_10;
  initializer_list<const_char_*> __l_08;
  const_string file_11;
  initializer_list<const_char_*> __l_09;
  const_string file_12;
  initializer_list<const_char_*> __l_10;
  const_string file_13;
  initializer_list<const_char_*> __l_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  string_view str;
  string_view str_00;
  check_type cVar26;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  allocator_type local_459;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  anon_class_8_1_8991fb9c get_opts;
  arith_uint256 *local_270;
  vector<const_char_*,_std::allocator<const_char_*>_> local_268;
  optional<uint256> **local_250;
  assertion_result local_248;
  allocator_type *local_230;
  undefined1 local_228 [9];
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1e0;
  undefined1 local_1c8 [60];
  _Storage<arith_uint256,_true> local_18c;
  undefined1 local_16c;
  _Storage<uint256,_true> local_168 [3];
  __index_type local_f8;
  undefined1 local_f0 [32];
  bool local_d0;
  undefined1 local_c8 [16];
  undefined1 auStack_b8 [16];
  string minimum_chainwork;
  string assume_valid;
  _Storage<arith_uint256,_true> *local_68;
  optional<uint256> *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_50.m_message.pn.pi_ = (sp_counted_base *)local_50.m_message.px;
  aStack_1f8._M_allocated_capacity = local_208._8_8_;
  auStack_b8._0_8_ = local_c8._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x329;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  get_opts.this = this;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._0_16_ = (lazy_ostream)0x0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar26 = 0x76beab;
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,&local_268);
  local_248._0_8_ = CONCAT71(local_248._1_7_,local_168[1]._0_1_) ^ 1;
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._24_8_ = &assume_valid;
  assume_valid._M_dataplus._M_p._0_1_ = 0x3a;
  assume_valid._M_dataplus._M_p._1_1_ = 0x5d;
  assume_valid._M_dataplus._M_p._2_1_ = 0xf5;
  assume_valid._M_dataplus._M_p._3_1_ = 0;
  assume_valid._M_dataplus._M_p._4_1_ = 0;
  assume_valid._M_dataplus._M_p._5_1_ = 0;
  assume_valid._M_dataplus._M_p._6_1_ = 0;
  assume_valid._M_dataplus._M_p._7_1_ = 0;
  assume_valid._M_string_length._0_1_ = 0x61;
  assume_valid._M_string_length._1_1_ = 0x5d;
  assume_valid._M_string_length._2_1_ = 0xf5;
  assume_valid._M_string_length._3_1_ = 0;
  assume_valid._M_string_length._4_1_ = 0;
  assume_valid._M_string_length._5_1_ = 0;
  assume_valid._M_string_length._6_1_ = 0;
  assume_valid._M_string_length._7_1_ = 0;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_01389048;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_2a8,0x329);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((_func_int **)
      local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x32a;
  file_00.m_begin = (iterator)&local_2b8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
             msg_00);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_50._0_8_ = "-assumevalid=";
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork,__l,
             (allocator_type *)&local_1e0);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  if ((bool)local_168[1]._0_1_ == true) {
    auVar17[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0] == '\0');
    auVar17[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[1] == '\0');
    auVar17[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[2] == '\0');
    auVar17[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[3] == '\0');
    auVar17[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[4] == '\0');
    auVar17[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[5] == '\0');
    auVar17[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[6] == '\0');
    auVar17[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[7] == '\0');
    auVar17[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[8] == '\0');
    auVar17[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[9] == '\0');
    auVar17[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[10] == '\0');
    auVar17[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xb] == '\0');
    auVar17[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xc] == '\0');
    auVar17[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xd] == '\0');
    auVar17[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xe] == '\0');
    auVar17[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xf] == '\0');
    auVar8[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x10] == '\0');
    auVar8[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x11] == '\0');
    auVar8[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x12] == '\0');
    auVar8[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x13] == '\0');
    auVar8[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x14] == '\0');
    auVar8[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x15] == '\0');
    auVar8[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x16] == '\0');
    auVar8[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x17] == '\0');
    auVar8[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == '\0');
    auVar8[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x19] == '\0');
    auVar8[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1a] == '\0');
    auVar8[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1b] == '\0');
    auVar8[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1c] == '\0');
    auVar8[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1d] == '\0');
    auVar8[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1e] == '\0');
    auVar8[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1f] == '\0');
    auVar8 = auVar8 & auVar17;
    assume_valid._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    assume_valid._M_dataplus._M_p._0_1_ = false;
  }
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_1_ = 0;
  assume_valid._M_string_length._2_1_ = 0;
  assume_valid._M_string_length._3_1_ = 0;
  assume_valid._M_string_length._4_1_ = 0;
  assume_valid._M_string_length._5_1_ = 0;
  assume_valid._M_string_length._6_1_ = 0;
  assume_valid._M_string_length._7_1_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid.field_2._M_local_buf[1] = '\0';
  assume_valid.field_2._M_local_buf[2] = '\0';
  assume_valid.field_2._M_local_buf[3] = '\0';
  assume_valid.field_2._M_local_buf[4] = '\0';
  assume_valid.field_2._M_local_buf[5] = '\0';
  assume_valid.field_2._M_local_buf[6] = '\0';
  assume_valid.field_2._M_local_buf[7] = '\0';
  local_c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_c8._8_8_ = (element_type *)0xf54b3e;
  local_208._0_8_ = local_168;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138e440;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)local_228;
  local_228._0_8_ = &uint256::ZERO;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389a00;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_f0._24_8_ = local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&assume_valid,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf55d70,
             (size_t)local_c8,0x32a,(lazy_ostream *)local_f0,"uint256::ZERO",&local_248);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&assume_valid.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  pvVar2 = (void *)CONCAT17(minimum_chainwork._M_dataplus._M_p._7_1_,
                            CONCAT16(minimum_chainwork._M_dataplus._M_p._6_1_,
                                     CONCAT15(minimum_chainwork._M_dataplus._M_p._5_1_,
                                              CONCAT14(minimum_chainwork._M_dataplus._M_p._4_1_,
                                                       CONCAT13(minimum_chainwork._M_dataplus._M_p.
                                                                _3_1_,CONCAT12(minimum_chainwork.
                                                                               _M_dataplus._M_p.
                                                                               _2_1_,CONCAT11(
                                                  minimum_chainwork._M_dataplus._M_p._1_1_,
                                                  minimum_chainwork._M_dataplus._M_p._0_1_)))))));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT17(minimum_chainwork.field_2._M_local_buf[7],
                                    CONCAT16(minimum_chainwork.field_2._M_local_buf[6],
                                             CONCAT15(minimum_chainwork.field_2._M_local_buf[5],
                                                      CONCAT14(minimum_chainwork.field_2.
                                                               _M_local_buf[4],
                                                               CONCAT13(minimum_chainwork.field_2.
                                                                        _M_local_buf[3],
                                                                        CONCAT12(minimum_chainwork.
                                                                                 field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(minimum_chainwork.field_2._M_local_buf[1]
                                                           ,minimum_chainwork.field_2._M_local_buf
                                                            [0]))))))) - (long)pvVar2);
  }
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x32b;
  file_01.m_begin = (iterator)&local_2d8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2e8,
             msg_01);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_50._0_8_ = "-assumevalid=0";
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_50;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork,__l_00,
             (allocator_type *)&local_1e0);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  if ((bool)local_168[1]._0_1_ == true) {
    auVar18[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0] == '\0');
    auVar18[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[1] == '\0');
    auVar18[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[2] == '\0');
    auVar18[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[3] == '\0');
    auVar18[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[4] == '\0');
    auVar18[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[5] == '\0');
    auVar18[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[6] == '\0');
    auVar18[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[7] == '\0');
    auVar18[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[8] == '\0');
    auVar18[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[9] == '\0');
    auVar18[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[10] == '\0');
    auVar18[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xb] == '\0');
    auVar18[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xc] == '\0');
    auVar18[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xd] == '\0');
    auVar18[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xe] == '\0');
    auVar18[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xf] == '\0');
    auVar9[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x10] == '\0');
    auVar9[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x11] == '\0');
    auVar9[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x12] == '\0');
    auVar9[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x13] == '\0');
    auVar9[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x14] == '\0');
    auVar9[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x15] == '\0');
    auVar9[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x16] == '\0');
    auVar9[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x17] == '\0');
    auVar9[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == '\0');
    auVar9[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x19] == '\0');
    auVar9[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1a] == '\0');
    auVar9[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1b] == '\0');
    auVar9[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1c] == '\0');
    auVar9[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1d] == '\0');
    auVar9[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1e] == '\0');
    auVar9[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1f] == '\0');
    auVar9 = auVar9 & auVar18;
    assume_valid._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    assume_valid._M_dataplus._M_p._0_1_ = false;
  }
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_1_ = 0;
  assume_valid._M_string_length._2_1_ = 0;
  assume_valid._M_string_length._3_1_ = 0;
  assume_valid._M_string_length._4_1_ = 0;
  assume_valid._M_string_length._5_1_ = 0;
  assume_valid._M_string_length._6_1_ = 0;
  assume_valid._M_string_length._7_1_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid.field_2._M_local_buf[1] = '\0';
  assume_valid.field_2._M_local_buf[2] = '\0';
  assume_valid.field_2._M_local_buf[3] = '\0';
  assume_valid.field_2._M_local_buf[4] = '\0';
  assume_valid.field_2._M_local_buf[5] = '\0';
  assume_valid.field_2._M_local_buf[6] = '\0';
  assume_valid.field_2._M_local_buf[7] = '\0';
  local_c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_c8._8_8_ = (element_type *)0xf54b3e;
  local_208._0_8_ = local_168;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138e440;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_228._0_8_ = &uint256::ZERO;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389a00;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)local_228;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_f0._24_8_ = local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&assume_valid,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf55db5,
             (size_t)local_c8,0x32b,(lazy_ostream *)local_f0,"uint256::ZERO",&local_248);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&assume_valid.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  pvVar2 = (void *)CONCAT17(minimum_chainwork._M_dataplus._M_p._7_1_,
                            CONCAT16(minimum_chainwork._M_dataplus._M_p._6_1_,
                                     CONCAT15(minimum_chainwork._M_dataplus._M_p._5_1_,
                                              CONCAT14(minimum_chainwork._M_dataplus._M_p._4_1_,
                                                       CONCAT13(minimum_chainwork._M_dataplus._M_p.
                                                                _3_1_,CONCAT12(minimum_chainwork.
                                                                               _M_dataplus._M_p.
                                                                               _2_1_,CONCAT11(
                                                  minimum_chainwork._M_dataplus._M_p._1_1_,
                                                  minimum_chainwork._M_dataplus._M_p._0_1_)))))));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT17(minimum_chainwork.field_2._M_local_buf[7],
                                    CONCAT16(minimum_chainwork.field_2._M_local_buf[6],
                                             CONCAT15(minimum_chainwork.field_2._M_local_buf[5],
                                                      CONCAT14(minimum_chainwork.field_2.
                                                               _M_local_buf[4],
                                                               CONCAT13(minimum_chainwork.field_2.
                                                                        _M_local_buf[3],
                                                                        CONCAT12(minimum_chainwork.
                                                                                 field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(minimum_chainwork.field_2._M_local_buf[1]
                                                           ,minimum_chainwork.field_2._M_local_buf
                                                            [0]))))))) - (long)pvVar2);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x32c;
  file_02.m_begin = (iterator)&local_2f8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_308,
             msg_02);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_50._0_8_ = "-noassumevalid";
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_50;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork,__l_01,
             (allocator_type *)&local_1e0);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)&minimum_chainwork);
  if ((bool)local_168[1]._0_1_ == true) {
    auVar19[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0] == '\0');
    auVar19[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[1] == '\0');
    auVar19[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[2] == '\0');
    auVar19[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[3] == '\0');
    auVar19[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[4] == '\0');
    auVar19[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[5] == '\0');
    auVar19[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[6] == '\0');
    auVar19[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[7] == '\0');
    auVar19[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[8] == '\0');
    auVar19[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[9] == '\0');
    auVar19[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[10] == '\0');
    auVar19[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xb] == '\0');
    auVar19[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xc] == '\0');
    auVar19[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xd] == '\0');
    auVar19[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xe] == '\0');
    auVar19[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xf] == '\0');
    auVar10[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x10] == '\0');
    auVar10[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x11] == '\0');
    auVar10[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x12] == '\0');
    auVar10[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x13] == '\0');
    auVar10[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x14] == '\0');
    auVar10[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x15] == '\0');
    auVar10[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x16] == '\0');
    auVar10[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x17] == '\0');
    auVar10[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == '\0');
    auVar10[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x19] == '\0');
    auVar10[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1a] == '\0');
    auVar10[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1b] == '\0');
    auVar10[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1c] == '\0');
    auVar10[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1d] == '\0');
    auVar10[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1e] == '\0');
    auVar10[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1f] == '\0');
    auVar10 = auVar10 & auVar19;
    assume_valid._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    assume_valid._M_dataplus._M_p._0_1_ = false;
  }
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_1_ = 0;
  assume_valid._M_string_length._2_1_ = 0;
  assume_valid._M_string_length._3_1_ = 0;
  assume_valid._M_string_length._4_1_ = 0;
  assume_valid._M_string_length._5_1_ = 0;
  assume_valid._M_string_length._6_1_ = 0;
  assume_valid._M_string_length._7_1_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid.field_2._M_local_buf[1] = '\0';
  assume_valid.field_2._M_local_buf[2] = '\0';
  assume_valid.field_2._M_local_buf[3] = '\0';
  assume_valid.field_2._M_local_buf[4] = '\0';
  assume_valid.field_2._M_local_buf[5] = '\0';
  assume_valid.field_2._M_local_buf[6] = '\0';
  assume_valid.field_2._M_local_buf[7] = '\0';
  local_c8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_c8._8_8_ = (element_type *)0xf54b3e;
  local_208._0_8_ = local_168;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138e440;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_228._0_8_ = &uint256::ZERO;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389a00;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)local_228;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_f0._24_8_ = local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&((_Storage<arith_uint256,_true> *)&assume_valid)->_M_value,
             (lazy_ostream *)&local_268,1,2,REQUIRE,0xf55dfb,(size_t)local_c8,0x32c,
             (lazy_ostream *)local_f0,"uint256::ZERO",&local_248);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&assume_valid.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  pvVar2 = (void *)CONCAT17(minimum_chainwork._M_dataplus._M_p._7_1_,
                            CONCAT16(minimum_chainwork._M_dataplus._M_p._6_1_,
                                     CONCAT15(minimum_chainwork._M_dataplus._M_p._5_1_,
                                              CONCAT14(minimum_chainwork._M_dataplus._M_p._4_1_,
                                                       CONCAT13(minimum_chainwork._M_dataplus._M_p.
                                                                _3_1_,CONCAT12(minimum_chainwork.
                                                                               _M_dataplus._M_p.
                                                                               _2_1_,CONCAT11(
                                                  minimum_chainwork._M_dataplus._M_p._1_1_,
                                                  minimum_chainwork._M_dataplus._M_p._0_1_)))))));
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT17(minimum_chainwork.field_2._M_local_buf[7],
                                    CONCAT16(minimum_chainwork.field_2._M_local_buf[6],
                                             CONCAT15(minimum_chainwork.field_2._M_local_buf[5],
                                                      CONCAT14(minimum_chainwork.field_2.
                                                               _M_local_buf[4],
                                                               CONCAT13(minimum_chainwork.field_2.
                                                                        _M_local_buf[3],
                                                                        CONCAT12(minimum_chainwork.
                                                                                 field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(minimum_chainwork.field_2._M_local_buf[1]
                                                           ,minimum_chainwork.field_2._M_local_buf
                                                            [0]))))))) - (long)pvVar2);
  }
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x32d;
  file_03.m_begin = (iterator)&local_318;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_328,
             msg_03);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf55e32;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_1e0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_c8,__l_02,
             (allocator_type *)&local_60);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_c8);
  assume_valid.field_2._M_local_buf[1] = '\0';
  assume_valid.field_2._M_local_buf[2] = '\0';
  assume_valid.field_2._M_local_buf[3] = '\0';
  assume_valid.field_2._M_local_buf[4] = '\0';
  assume_valid.field_2._M_local_buf[5] = '\0';
  assume_valid.field_2._M_local_buf[6] = '\0';
  assume_valid.field_2._M_local_buf[7] = '\0';
  assume_valid.field_2._M_local_buf[8] = '\0';
  assume_valid.field_2._M_local_buf[9] = '\0';
  assume_valid.field_2._M_local_buf[10] = '\0';
  assume_valid.field_2._M_local_buf[0xb] = '\0';
  assume_valid.field_2._M_local_buf[0xc] = '\0';
  assume_valid.field_2._M_local_buf[0xd] = '\0';
  assume_valid.field_2._M_local_buf[0xe] = '\0';
  assume_valid.field_2._M_local_buf[0xf] = '\0';
  assume_valid._M_dataplus._M_p._1_1_ = 0;
  assume_valid._M_dataplus._M_p._2_1_ = 0;
  assume_valid._M_dataplus._M_p._3_1_ = 0;
  assume_valid._M_dataplus._M_p._4_1_ = 0;
  assume_valid._M_dataplus._M_p._5_1_ = 0;
  assume_valid._M_dataplus._M_p._6_1_ = 0;
  assume_valid._M_dataplus._M_p._7_1_ = 0;
  assume_valid._M_string_length._0_1_ = 0;
  assume_valid._M_string_length._1_1_ = 0;
  assume_valid._M_string_length._2_1_ = 0;
  assume_valid._M_string_length._3_1_ = 0;
  assume_valid._M_string_length._4_1_ = 0;
  assume_valid._M_string_length._5_1_ = 0;
  assume_valid._M_string_length._6_1_ = 0;
  assume_valid._M_string_length._7_1_ = 0;
  assume_valid.field_2._M_local_buf[0] = '\0';
  assume_valid._M_dataplus._M_p._0_1_ = 0x12;
  if ((bool)local_168[1]._0_1_ == true) {
    auVar24[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0] == '\x12');
    auVar24[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[1] == '\0');
    auVar24[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[2] == '\0');
    auVar24[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[3] == '\0');
    auVar24[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[4] == '\0');
    auVar24[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[5] == '\0');
    auVar24[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[6] == '\0');
    auVar24[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[7] == '\0');
    auVar24[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[8] == '\0');
    auVar24[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[9] == '\0');
    auVar24[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[10] == '\0');
    auVar24[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xb] == '\0');
    auVar24[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xc] == '\0');
    auVar24[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xd] == '\0');
    auVar24[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xe] == '\0');
    auVar24[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xf] == '\0');
    auVar13[0] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x10] == '\0');
    auVar13[1] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x11] == '\0');
    auVar13[2] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x12] == '\0');
    auVar13[3] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x13] == '\0');
    auVar13[4] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x14] == '\0');
    auVar13[5] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x15] == '\0');
    auVar13[6] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x16] == '\0');
    auVar13[7] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x17] == '\0');
    auVar13[8] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == '\0');
    auVar13[9] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x19] == '\0');
    auVar13[10] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1a] == '\0');
    auVar13[0xb] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1b] == '\0');
    auVar13[0xc] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1c] == '\0');
    auVar13[0xd] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1d] == '\0');
    auVar13[0xe] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1e] == '\0');
    auVar13[0xf] = -(local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1f] == '\0');
    auVar13 = auVar13 & auVar24;
    minimum_chainwork._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    minimum_chainwork._M_dataplus._M_p._0_1_ = false;
  }
  minimum_chainwork._M_string_length._0_1_ = 0;
  minimum_chainwork._M_string_length._1_1_ = 0;
  minimum_chainwork._M_string_length._2_1_ = 0;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  minimum_chainwork.field_2._M_local_buf[0] = '\0';
  minimum_chainwork.field_2._M_local_buf[1] = '\0';
  minimum_chainwork.field_2._M_local_buf[2] = '\0';
  minimum_chainwork.field_2._M_local_buf[3] = '\0';
  minimum_chainwork.field_2._M_local_buf[4] = '\0';
  minimum_chainwork.field_2._M_local_buf[5] = '\0';
  minimum_chainwork.field_2._M_local_buf[6] = '\0';
  minimum_chainwork.field_2._M_local_buf[7] = '\0';
  local_208._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_208._8_8_ = (element_type *)0xf54b3e;
  local_228._0_8_ = local_168;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138e440;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = local_228;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389a00;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_230 = (allocator_type *)&local_50;
  local_50._0_8_ = (_Storage<arith_uint256,_true> *)&assume_valid;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&minimum_chainwork,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf55e44,
             (size_t)local_208,0x32d,(lazy_ostream *)local_f0,"uint256{0x12}",&local_248);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&minimum_chainwork.field_2._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((_Storage<arith_uint256,_true> *)local_c8._0_8_ != (_Storage<arith_uint256,_true> *)0x0) {
    operator_delete((void *)local_c8._0_8_,auStack_b8._0_8_ - local_c8._0_8_);
  }
  paVar1 = &assume_valid.field_2;
  assume_valid._M_dataplus._M_p._0_1_ = SUB81(paVar1,0);
  assume_valid._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar1 >> 8);
  assume_valid._M_dataplus._M_p._2_1_ = (undefined1)((ulong)paVar1 >> 0x10);
  assume_valid._M_dataplus._M_p._3_1_ = (undefined1)((ulong)paVar1 >> 0x18);
  assume_valid._M_dataplus._M_p._4_1_ = (undefined1)((ulong)paVar1 >> 0x20);
  assume_valid._M_dataplus._M_p._5_1_ = (undefined1)((ulong)paVar1 >> 0x28);
  assume_valid._M_dataplus._M_p._6_1_ = (undefined1)((ulong)paVar1 >> 0x30);
  assume_valid._M_dataplus._M_p._7_1_ = (undefined1)((ulong)paVar1 >> 0x38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&assume_valid,
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef","");
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x330;
  file_04.m_begin = (iterator)&local_338;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_348,
             msg_04);
  minimum_chainwork._M_string_length._0_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._0_1_ = 8;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0x8f;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0x38;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 1;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork.field_2._M_local_buf[0] = '8';
  minimum_chainwork.field_2._M_local_buf[1] = -0x2f;
  minimum_chainwork.field_2._M_local_buf[2] = '9';
  minimum_chainwork.field_2._M_local_buf[3] = '\x01';
  minimum_chainwork.field_2._M_local_buf[4] = '\0';
  minimum_chainwork.field_2._M_local_buf[5] = '\0';
  minimum_chainwork.field_2._M_local_buf[6] = '\0';
  minimum_chainwork.field_2._M_local_buf[7] = '\0';
  minimum_chainwork.field_2._M_local_buf[8] = -0x5f;
  minimum_chainwork.field_2._M_local_buf[9] = -0x52;
  minimum_chainwork.field_2._M_local_buf[10] = -0xc;
  minimum_chainwork.field_2._M_local_buf[0xb] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xc] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xd] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xe] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xf] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "-assumevalid=",&assume_valid);
  local_68 = (_Storage<arith_uint256,_true> *)local_c8._0_8_;
  paVar4 = (allocator_type *)&local_270;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_68;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_228,__l_03,paVar4);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_228);
  str._M_len._1_1_ = assume_valid._M_dataplus._M_p._1_1_;
  str._M_len._0_1_ = assume_valid._M_dataplus._M_p._0_1_;
  str._M_len._2_1_ = assume_valid._M_dataplus._M_p._2_1_;
  str._M_len._3_1_ = assume_valid._M_dataplus._M_p._3_1_;
  str._M_len._4_1_ = assume_valid._M_dataplus._M_p._4_1_;
  str._M_len._5_1_ = assume_valid._M_dataplus._M_p._5_1_;
  str._M_len._6_1_ = assume_valid._M_dataplus._M_p._6_1_;
  str._M_len._7_1_ = assume_valid._M_dataplus._M_p._7_1_;
  str._M_str = (char *)paVar4;
  detail::FromHex<uint256>
            ((optional<uint256> *)local_f0,
             (detail *)
             CONCAT17(assume_valid._M_string_length._7_1_,
                      CONCAT16(assume_valid._M_string_length._6_1_,
                               CONCAT15(assume_valid._M_string_length._5_1_,
                                        CONCAT14(assume_valid._M_string_length._4_1_,
                                                 CONCAT13(assume_valid._M_string_length._3_1_,
                                                          CONCAT12(assume_valid._M_string_length.
                                                                   _2_1_,CONCAT11(assume_valid.
                                                                                  _M_string_length.
                                                                                  _1_1_,(undefined1)
                                                                                        assume_valid
                                                                                        .
                                                  _M_string_length))))))),str);
  bVar7 = (bool)local_168[1]._0_1_ == local_d0;
  if ((local_168[1]._0_1_ & bVar7) == 1) {
    auVar20[0] = -(local_f0[0] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0]);
    auVar20[1] = -(local_f0[1] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[1]);
    auVar20[2] = -(local_f0[2] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[2]);
    auVar20[3] = -(local_f0[3] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[3]);
    auVar20[4] = -(local_f0[4] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[4]);
    auVar20[5] = -(local_f0[5] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[5]);
    auVar20[6] = -(local_f0[6] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[6]);
    auVar20[7] = -(local_f0[7] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[7]);
    auVar20[8] = -(local_f0[8] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[8]);
    auVar20[9] = -(local_f0[9] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[9]);
    auVar20[10] = -(local_f0[10] == local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[10])
    ;
    auVar20[0xb] = -(local_f0[0xb] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar20[0xc] = -(local_f0[0xc] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar20[0xd] = -(local_f0[0xd] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar20[0xe] = -(local_f0[0xe] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar20[0xf] = -(local_f0[0xf] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar11[0] = -(local_f0[0x10] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar11[1] = -(local_f0[0x11] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar11[2] = -(local_f0[0x12] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar11[3] = -(local_f0[0x13] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar11[4] = -(local_f0[0x14] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar11[5] = -(local_f0[0x15] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar11[6] = -(local_f0[0x16] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar11[7] = -(local_f0[0x17] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar11[8] = -(local_f0[0x18] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar11[9] = -(local_f0[0x19] ==
                  local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar11[10] = -(local_f0[0x1a] ==
                   local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar11[0xb] = -(local_f0[0x1b] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar11[0xc] = -(local_f0[0x1c] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar11[0xd] = -(local_f0[0x1d] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar11[0xe] = -(local_f0[0x1e] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar11[0xf] = -(local_f0[0x1f] ==
                    local_168[0]._M_value.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar11 = auVar11 & auVar20;
    bVar7 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
  }
  local_208[0] = bVar7;
  local_208._8_8_ = (element_type *)0x0;
  aStack_1f8._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_50._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_50.m_message.px = (element_type *)0xf54b3e;
  local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_168;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_0138e440;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)&local_1e0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_0138e440;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = &local_60;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_60 = (optional<uint256> *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)&minimum_chainwork,1,2,REQUIRE,0xf55ecd,
             (size_t)&local_50,0x330,&local_248,"uint256::FromHex(assume_valid)",
             (lazy_ostream *)&local_268);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1f8._M_allocated_capacity);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((_Storage<uint256,_true> *)local_228._0_8_ != (_Storage<uint256,_true> *)0x0) {
    operator_delete((void *)local_228._0_8_,
                    CONCAT17(cStack_211,
                             CONCAT16(cStack_212,
                                      CONCAT15(cStack_213,
                                               CONCAT14(cStack_214,
                                                        CONCAT13(cStack_215,
                                                                 CONCAT12(cStack_216,
                                                                          CONCAT11(cStack_217,
                                                                                   local_218)))))))
                    - local_228._0_8_);
  }
  if ((_Storage<arith_uint256,_true> *)local_c8._0_8_ != (_Storage<arith_uint256,_true> *)auStack_b8
     ) {
    operator_delete((void *)local_c8._0_8_,auStack_b8._0_8_ + 1);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x332;
  file_05.m_begin = (iterator)&local_358;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_c8._0_8_ = "-assumevalid=xyz";
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_c8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_268,__l_04,(allocator_type *)local_208);
  _cVar26 = 0x76cb04;
  test_method::anon_class_8_1_8991fb9c::operator()
            ((Result<kernel::ChainstateManagerOpts> *)local_1c8,&get_opts,&local_268);
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_f8 != '\x01');
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0x4c;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0x5f;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0xf5;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0x6b;
  minimum_chainwork._M_string_length._1_1_ = 0x5f;
  minimum_chainwork._M_string_length._2_1_ = 0xf5;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_01389048;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_370 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_f0._24_8_ = &minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_378,0x332);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                    local_1c8);
  if ((_func_int **)
      local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x333;
  file_06.m_begin = (iterator)&local_388;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  local_c8._0_8_ = "-assumevalid=01234567890123456789012345678901234567890123456789012345678901234";
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_c8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_268,__l_05,(allocator_type *)local_208);
  _cVar26 = 0x76cc4e;
  test_method::anon_class_8_1_8991fb9c::operator()
            ((Result<kernel::ChainstateManagerOpts> *)local_1c8,&get_opts,&local_268);
  local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_f8 != '\x01');
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0xbb;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0x5f;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0xf5;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0x18;
  minimum_chainwork._M_string_length._1_1_ = 0x60;
  minimum_chainwork._M_string_length._2_1_ = 0xf5;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_01389048;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_f0._24_8_ = &minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_3a8,0x333);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                    local_1c8);
  if ((_func_int **)
      local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x336;
  file_07.m_begin = (iterator)&local_3b8;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3c8,
             msg_07);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._0_16_ = (lazy_ostream)0x0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _cVar26 = 0x76cd7c;
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,&local_268);
  local_248._0_8_ = CONCAT71(local_248._1_7_,local_16c) ^ 1;
  local_248.m_message.px = (element_type *)0x0;
  local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0x19;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0x60;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0xf5;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0x3f;
  minimum_chainwork._M_string_length._1_1_ = 0x60;
  minimum_chainwork._M_string_length._2_1_ = 0xf5;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_01389048;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3d0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_f0._24_8_ = &minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_3d8,0x336);
  boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((_func_int **)
      local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x337;
  file_08.m_begin = (iterator)&local_3e8;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3f8,
             msg_08);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_60 = (optional<uint256> *)0xf56040;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&local_60;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208,__l_06,
             (allocator_type *)&local_68);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
  minimum_chainwork.field_2._M_local_buf[0] = '\0';
  minimum_chainwork.field_2._M_local_buf[1] = '\0';
  minimum_chainwork.field_2._M_local_buf[2] = '\0';
  minimum_chainwork.field_2._M_local_buf[3] = '\0';
  minimum_chainwork.field_2._M_local_buf[4] = '\0';
  minimum_chainwork.field_2._M_local_buf[5] = '\0';
  minimum_chainwork.field_2._M_local_buf[6] = '\0';
  minimum_chainwork.field_2._M_local_buf[7] = '\0';
  minimum_chainwork.field_2._M_local_buf[8] = '\0';
  minimum_chainwork.field_2._M_local_buf[9] = '\0';
  minimum_chainwork.field_2._M_local_buf[10] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xb] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xc] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xd] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xe] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xf] = '\0';
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0;
  minimum_chainwork._M_string_length._1_1_ = 0;
  minimum_chainwork._M_string_length._2_1_ = 0;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  if ((bool)local_16c == true) {
    auVar21[0] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._0_1_ == '\0');
    auVar21[1] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._1_1_ == '\0');
    auVar21[2] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._2_1_ == '\0');
    auVar21[3] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._3_1_ == '\0');
    auVar21[4] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._0_1_ == '\0');
    auVar21[5] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._1_1_ == '\0');
    auVar21[6] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._2_1_ == '\0');
    auVar21[7] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._3_1_ == '\0');
    auVar21[8] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._0_1_ == '\0');
    auVar21[9] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._1_1_ == '\0');
    auVar21[10] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._2_1_ == '\0');
    auVar21[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._3_1_ == '\0');
    auVar21[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._0_1_ == '\0');
    auVar21[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._1_1_ == '\0');
    auVar21[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._2_1_ == '\0');
    auVar21[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._3_1_ == '\0');
    auVar14[0] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._0_1_ == '\0');
    auVar14[1] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._1_1_ == '\0');
    auVar14[2] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._2_1_ == '\0');
    auVar14[3] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._3_1_ == '\0');
    auVar14[4] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._0_1_ == '\0');
    auVar14[5] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._1_1_ == '\0');
    auVar14[6] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._2_1_ == '\0');
    auVar14[7] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._3_1_ == '\0');
    auVar14[8] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._0_1_ == '\0');
    auVar14[9] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._1_1_ == '\0');
    auVar14[10] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._2_1_ == '\0');
    auVar14[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._3_1_ == '\0');
    auVar14[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._0_1_ == '\0');
    auVar14[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._1_1_ == '\0');
    auVar14[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._2_1_ == '\0');
    auVar14[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._3_1_ == '\0');
    auVar14 = auVar14 & auVar21;
    bVar7 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    bVar7 = false;
  }
  local_c8[0] = bVar7;
  local_c8._8_8_ = (element_type *)0x0;
  auStack_b8._0_8_ = (sp_counted_base *)0x0;
  local_228._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  stack0xfffffffffffffde0 = (pointer)0xf54b3e;
  local_50._0_8_ = &local_18c;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138ebf0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = &local_50;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389940;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)&local_1e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_c8,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf56054,
             (size_t)local_228,0x337,(lazy_ostream *)local_f0,"arith_uint256()",&local_248);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_b8);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_208._0_8_,aStack_1f8._M_allocated_capacity - local_208._0_8_);
  }
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x338;
  file_09.m_begin = (iterator)&local_408;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_418,
             msg_09);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_60 = (optional<uint256> *)0xf5609f;
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&local_60;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208,__l_07,
             (allocator_type *)&local_68);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
  minimum_chainwork.field_2._M_local_buf[0] = '\0';
  minimum_chainwork.field_2._M_local_buf[1] = '\0';
  minimum_chainwork.field_2._M_local_buf[2] = '\0';
  minimum_chainwork.field_2._M_local_buf[3] = '\0';
  minimum_chainwork.field_2._M_local_buf[4] = '\0';
  minimum_chainwork.field_2._M_local_buf[5] = '\0';
  minimum_chainwork.field_2._M_local_buf[6] = '\0';
  minimum_chainwork.field_2._M_local_buf[7] = '\0';
  minimum_chainwork.field_2._M_local_buf[8] = '\0';
  minimum_chainwork.field_2._M_local_buf[9] = '\0';
  minimum_chainwork.field_2._M_local_buf[10] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xb] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xc] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xd] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xe] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xf] = '\0';
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0;
  minimum_chainwork._M_string_length._1_1_ = 0;
  minimum_chainwork._M_string_length._2_1_ = 0;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  if ((bool)local_16c == true) {
    auVar22[0] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._0_1_ == '\0');
    auVar22[1] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._1_1_ == '\0');
    auVar22[2] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._2_1_ == '\0');
    auVar22[3] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._3_1_ == '\0');
    auVar22[4] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._0_1_ == '\0');
    auVar22[5] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._1_1_ == '\0');
    auVar22[6] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._2_1_ == '\0');
    auVar22[7] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._3_1_ == '\0');
    auVar22[8] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._0_1_ == '\0');
    auVar22[9] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._1_1_ == '\0');
    auVar22[10] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._2_1_ == '\0');
    auVar22[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._3_1_ == '\0');
    auVar22[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._0_1_ == '\0');
    auVar22[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._1_1_ == '\0');
    auVar22[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._2_1_ == '\0');
    auVar22[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._3_1_ == '\0');
    auVar15[0] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._0_1_ == '\0');
    auVar15[1] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._1_1_ == '\0');
    auVar15[2] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._2_1_ == '\0');
    auVar15[3] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._3_1_ == '\0');
    auVar15[4] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._0_1_ == '\0');
    auVar15[5] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._1_1_ == '\0');
    auVar15[6] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._2_1_ == '\0');
    auVar15[7] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._3_1_ == '\0');
    auVar15[8] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._0_1_ == '\0');
    auVar15[9] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._1_1_ == '\0');
    auVar15[10] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._2_1_ == '\0');
    auVar15[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._3_1_ == '\0');
    auVar15[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._0_1_ == '\0');
    auVar15[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._1_1_ == '\0');
    auVar15[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._2_1_ == '\0');
    auVar15[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._3_1_ == '\0');
    auVar15 = auVar15 & auVar22;
    bVar7 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    bVar7 = false;
  }
  local_c8[0] = bVar7;
  local_c8._8_8_ = (element_type *)0x0;
  auStack_b8._0_8_ = (sp_counted_base *)0x0;
  local_228._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  stack0xfffffffffffffde0 = (pointer)0xf54b3e;
  local_50._0_8_ = &local_18c;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138ebf0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = &local_50;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389940;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)&local_1e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_c8,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf560b3,
             (size_t)local_228,0x338,(lazy_ostream *)local_f0,"arith_uint256()",&local_248);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_b8);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_208._0_8_,aStack_1f8._M_allocated_capacity - local_208._0_8_);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x339;
  file_10.m_begin = (iterator)&local_428;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = &PTR__lazy_ostream_01388f08;
  local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_250 = (optional<uint256> **)0xf4aea1;
  local_60 = (optional<uint256> *)0xf560ee;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&local_60;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208,__l_08,
             (allocator_type *)&local_68);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
  minimum_chainwork._M_dataplus._M_p._0_1_ = 0x34;
  minimum_chainwork._M_dataplus._M_p._1_1_ = 0x12;
  minimum_chainwork._M_dataplus._M_p._2_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._3_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._4_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._5_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._6_1_ = 0;
  minimum_chainwork._M_dataplus._M_p._7_1_ = 0;
  minimum_chainwork._M_string_length._0_1_ = 0;
  minimum_chainwork._M_string_length._1_1_ = 0;
  minimum_chainwork._M_string_length._2_1_ = 0;
  minimum_chainwork._M_string_length._3_1_ = 0;
  minimum_chainwork._M_string_length._4_1_ = 0;
  minimum_chainwork._M_string_length._5_1_ = 0;
  minimum_chainwork._M_string_length._6_1_ = 0;
  minimum_chainwork._M_string_length._7_1_ = 0;
  minimum_chainwork.field_2._M_local_buf[0] = '\0';
  minimum_chainwork.field_2._M_local_buf[1] = '\0';
  minimum_chainwork.field_2._M_local_buf[2] = '\0';
  minimum_chainwork.field_2._M_local_buf[3] = '\0';
  minimum_chainwork.field_2._M_local_buf[4] = '\0';
  minimum_chainwork.field_2._M_local_buf[5] = '\0';
  minimum_chainwork.field_2._M_local_buf[6] = '\0';
  minimum_chainwork.field_2._M_local_buf[7] = '\0';
  minimum_chainwork.field_2._M_local_buf[8] = '\0';
  minimum_chainwork.field_2._M_local_buf[9] = '\0';
  minimum_chainwork.field_2._M_local_buf[10] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xb] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xc] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xd] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xe] = '\0';
  minimum_chainwork.field_2._M_local_buf[0xf] = '\0';
  if ((bool)local_16c == true) {
    auVar25[0] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._0_1_ == '\0');
    auVar25[1] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._1_1_ == '\0');
    auVar25[2] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._2_1_ == '\0');
    auVar25[3] = -(local_18c._M_value.super_base_uint<256U>.pn[4]._3_1_ == '\0');
    auVar25[4] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._0_1_ == '\0');
    auVar25[5] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._1_1_ == '\0');
    auVar25[6] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._2_1_ == '\0');
    auVar25[7] = -(local_18c._M_value.super_base_uint<256U>.pn[5]._3_1_ == '\0');
    auVar25[8] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._0_1_ == '\0');
    auVar25[9] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._1_1_ == '\0');
    auVar25[10] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._2_1_ == '\0');
    auVar25[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[6]._3_1_ == '\0');
    auVar25[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._0_1_ == '\0');
    auVar25[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._1_1_ == '\0');
    auVar25[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._2_1_ == '\0');
    auVar25[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[7]._3_1_ == '\0');
    auVar16[0] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._0_1_ == '4');
    auVar16[1] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._1_1_ == '\x12');
    auVar16[2] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._2_1_ == '\0');
    auVar16[3] = -(local_18c._M_value.super_base_uint<256U>.pn[0]._3_1_ == '\0');
    auVar16[4] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._0_1_ == '\0');
    auVar16[5] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._1_1_ == '\0');
    auVar16[6] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._2_1_ == '\0');
    auVar16[7] = -(local_18c._M_value.super_base_uint<256U>.pn[1]._3_1_ == '\0');
    auVar16[8] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._0_1_ == '\0');
    auVar16[9] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._1_1_ == '\0');
    auVar16[10] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._2_1_ == '\0');
    auVar16[0xb] = -(local_18c._M_value.super_base_uint<256U>.pn[2]._3_1_ == '\0');
    auVar16[0xc] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._0_1_ == '\0');
    auVar16[0xd] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._1_1_ == '\0');
    auVar16[0xe] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._2_1_ == '\0');
    auVar16[0xf] = -(local_18c._M_value.super_base_uint<256U>.pn[3]._3_1_ == '\0');
    auVar16 = auVar16 & auVar25;
    bVar7 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    bVar7 = false;
  }
  local_c8[0] = bVar7;
  local_c8._8_8_ = (element_type *)0x0;
  auStack_b8._0_8_ = (sp_counted_base *)0x0;
  local_228._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  stack0xfffffffffffffde0 = (pointer)0xf54b3e;
  local_50._0_8_ = &local_18c;
  local_f0[8] = false;
  local_f0._0_8_ = &PTR__lazy_ostream_0138ebf0;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = &local_50;
  local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
  local_248._0_8_ = &PTR__lazy_ostream_01389940;
  local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = (allocator_type *)&local_1e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&minimum_chainwork;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_c8,(lazy_ostream *)&local_268,1,2,REQUIRE,0xf56107,
             (size_t)local_228,0x339,(lazy_ostream *)local_f0,"arith_uint256{0x1234}",&local_248);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_b8);
  std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_208._0_8_,aStack_1f8._M_allocated_capacity - local_208._0_8_);
  }
  paVar1 = &minimum_chainwork.field_2;
  minimum_chainwork._M_dataplus._M_p._0_1_ = SUB81(paVar1,0);
  minimum_chainwork._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar1 >> 8);
  minimum_chainwork._M_dataplus._M_p._2_1_ = (undefined1)((ulong)paVar1 >> 0x10);
  minimum_chainwork._M_dataplus._M_p._3_1_ = (undefined1)((ulong)paVar1 >> 0x18);
  minimum_chainwork._M_dataplus._M_p._4_1_ = (undefined1)((ulong)paVar1 >> 0x20);
  minimum_chainwork._M_dataplus._M_p._5_1_ = (undefined1)((ulong)paVar1 >> 0x28);
  minimum_chainwork._M_dataplus._M_p._6_1_ = (undefined1)((ulong)paVar1 >> 0x30);
  minimum_chainwork._M_dataplus._M_p._7_1_ = (undefined1)((ulong)paVar1 >> 0x38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&minimum_chainwork,
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef","");
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x33c;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  local_c8._8_8_ = local_c8._9_8_ << 8;
  local_c8._0_8_ = &PTR__lazy_ostream_01388f08;
  auStack_b8._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_b8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "-minimumchainwork=",&minimum_chainwork);
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_;
  paVar4 = &local_459;
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&local_1e8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_1e0,__l_09,paVar4);
  test_method::anon_class_8_1_5dbb9ce7::operator()
            ((T *)local_1c8,(anon_class_8_1_5dbb9ce7 *)&get_opts,&local_1e0);
  str_00._M_len._1_1_ = minimum_chainwork._M_dataplus._M_p._1_1_;
  str_00._M_len._0_1_ = minimum_chainwork._M_dataplus._M_p._0_1_;
  str_00._M_len._2_1_ = minimum_chainwork._M_dataplus._M_p._2_1_;
  str_00._M_len._3_1_ = minimum_chainwork._M_dataplus._M_p._3_1_;
  str_00._M_len._4_1_ = minimum_chainwork._M_dataplus._M_p._4_1_;
  str_00._M_len._5_1_ = minimum_chainwork._M_dataplus._M_p._5_1_;
  str_00._M_len._6_1_ = minimum_chainwork._M_dataplus._M_p._6_1_;
  str_00._M_len._7_1_ = minimum_chainwork._M_dataplus._M_p._7_1_;
  str_00._M_str = (char *)paVar4;
  detail::FromHex<uint256>
            ((optional<uint256> *)local_f0,
             (detail *)
             CONCAT17(minimum_chainwork._M_string_length._7_1_,
                      CONCAT16(minimum_chainwork._M_string_length._6_1_,
                               CONCAT15(minimum_chainwork._M_string_length._5_1_,
                                        CONCAT14(minimum_chainwork._M_string_length._4_1_,
                                                 CONCAT13(minimum_chainwork._M_string_length._3_1_,
                                                          CONCAT12(minimum_chainwork.
                                                                   _M_string_length._2_1_,
                                                                   CONCAT11(minimum_chainwork.
                                                                            _M_string_length._1_1_,
                                                                            (undefined1)
                                                                            minimum_chainwork.
                                                                            _M_string_length))))))),
             str_00);
  if (local_d0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    UintToArith256((arith_uint256 *)local_228,(uint256 *)local_f0);
    if ((bool)local_16c == true) {
      auVar23[0] = -(local_228[0] ==
                    (allocator_type)local_18c._M_value.super_base_uint<256U>.pn[0]._0_1_);
      auVar23[1] = -(local_228[1] == local_18c._M_value.super_base_uint<256U>.pn[0]._1_1_);
      auVar23[2] = -(local_228[2] == local_18c._M_value.super_base_uint<256U>.pn[0]._2_1_);
      auVar23[3] = -(local_228[3] == local_18c._M_value.super_base_uint<256U>.pn[0]._3_1_);
      auVar23[4] = -(local_228[4] == local_18c._M_value.super_base_uint<256U>.pn[1]._0_1_);
      auVar23[5] = -(local_228[5] == local_18c._M_value.super_base_uint<256U>.pn[1]._1_1_);
      auVar23[6] = -(local_228[6] == local_18c._M_value.super_base_uint<256U>.pn[1]._2_1_);
      auVar23[7] = -(local_228[7] == local_18c._M_value.super_base_uint<256U>.pn[1]._3_1_);
      auVar23[8] = -(local_228[8] == local_18c._M_value.super_base_uint<256U>.pn[2]._0_1_);
      auVar23[9] = -(cStack_21f == local_18c._M_value.super_base_uint<256U>.pn[2]._1_1_);
      auVar23[10] = -(cStack_21e == local_18c._M_value.super_base_uint<256U>.pn[2]._2_1_);
      auVar23[0xb] = -(cStack_21d == local_18c._M_value.super_base_uint<256U>.pn[2]._3_1_);
      auVar23[0xc] = -(cStack_21c == local_18c._M_value.super_base_uint<256U>.pn[3]._0_1_);
      auVar23[0xd] = -(cStack_21b == local_18c._M_value.super_base_uint<256U>.pn[3]._1_1_);
      auVar23[0xe] = -(cStack_21a == local_18c._M_value.super_base_uint<256U>.pn[3]._2_1_);
      auVar23[0xf] = -(cStack_219 == local_18c._M_value.super_base_uint<256U>.pn[3]._3_1_);
      auVar12[0] = -(local_218 == local_18c._M_value.super_base_uint<256U>.pn[4]._0_1_);
      auVar12[1] = -(cStack_217 == local_18c._M_value.super_base_uint<256U>.pn[4]._1_1_);
      auVar12[2] = -(cStack_216 == local_18c._M_value.super_base_uint<256U>.pn[4]._2_1_);
      auVar12[3] = -(cStack_215 == local_18c._M_value.super_base_uint<256U>.pn[4]._3_1_);
      auVar12[4] = -(cStack_214 == local_18c._M_value.super_base_uint<256U>.pn[5]._0_1_);
      auVar12[5] = -(cStack_213 == local_18c._M_value.super_base_uint<256U>.pn[5]._1_1_);
      auVar12[6] = -(cStack_212 == local_18c._M_value.super_base_uint<256U>.pn[5]._2_1_);
      auVar12[7] = -(cStack_211 == local_18c._M_value.super_base_uint<256U>.pn[5]._3_1_);
      auVar12[8] = -(cStack_210 == local_18c._M_value.super_base_uint<256U>.pn[6]._0_1_);
      auVar12[9] = -(cStack_20f == local_18c._M_value.super_base_uint<256U>.pn[6]._1_1_);
      auVar12[10] = -(cStack_20e == local_18c._M_value.super_base_uint<256U>.pn[6]._2_1_);
      auVar12[0xb] = -(cStack_20d == local_18c._M_value.super_base_uint<256U>.pn[6]._3_1_);
      auVar12[0xc] = -(cStack_20c == local_18c._M_value.super_base_uint<256U>.pn[7]._0_1_);
      auVar12[0xd] = -(cStack_20b == local_18c._M_value.super_base_uint<256U>.pn[7]._1_1_);
      auVar12[0xe] = -(cStack_20a == local_18c._M_value.super_base_uint<256U>.pn[7]._2_1_);
      auVar12[0xf] = -(cStack_209 == local_18c._M_value.super_base_uint<256U>.pn[7]._3_1_);
      auVar12 = auVar12 & auVar23;
      bVar7 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
    }
    else {
      bVar7 = false;
    }
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar7;
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = (optional<uint256> *)0xf54ac3;
    local_58 = "";
    local_68 = &local_18c;
    local_248.m_message.px = (element_type *)(local_248.m_message._1_8_ << 8);
    local_248._0_8_ = &PTR__lazy_ostream_0138ebf0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = &PTR__lazy_ostream_01389940;
    local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_250 = (optional<uint256> **)&local_270;
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x2;
    local_270 = (arith_uint256 *)local_228;
    local_230 = (allocator_type *)&local_68;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_c8,1,2,REQUIRE,0xf56170,(size_t)&local_60,0x33c,
               &local_248,"UintToArith256(uint256::FromHex(minimum_chainwork).value())",
               (lazy_ostream *)&local_268);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    std::filesystem::__cxx11::path::~path((path *)(local_1c8 + 8));
    if ((string *)
        local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (string *)0x0) {
      operator_delete(local_1e0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != &aStack_1f8) {
      operator_delete((void *)local_208._0_8_,(ulong)(aStack_1f8._M_allocated_capacity + 1));
    }
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_468 = "";
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x33e;
    file_12.m_begin = (iterator)&local_470;
    msg_12.m_end = pvVar6;
    msg_12.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_480,
               msg_12);
    local_208._0_8_ = "-minimumchainwork=xyz";
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)local_208;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&local_268,__l_10,(allocator_type *)local_228);
    _cVar26 = 0x76d825;
    test_method::anon_class_8_1_8991fb9c::operator()
              ((Result<kernel::ChainstateManagerOpts> *)local_1c8,&get_opts,&local_268);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_f8 != '\x01');
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c8._0_8_ = "!get_opts({\"-minimumchainwork=xyz\"})";
    local_c8._8_8_ = (element_type *)0xf5623e;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_01389048;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_488 = "";
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x0;
    local_f0._24_8_ = (lazy_ostream *)local_c8;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_490,0x33e);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                        local_1c8);
    if ((_func_int **)
        local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_268.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_498 = "";
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x33f;
    file_13.m_begin = (iterator)&local_4a0;
    msg_13.m_end = pvVar6;
    msg_13.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4b0,
               msg_13);
    local_208._0_8_ =
         "-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234";
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)local_208;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&local_268,__l_11,(allocator_type *)local_228);
    _cVar26 = 0x76d95f;
    test_method::anon_class_8_1_8991fb9c::operator()
              ((Result<kernel::ChainstateManagerOpts> *)local_1c8,&get_opts,&local_268);
    local_248.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_f8 != '\x01');
    local_248.m_message.px = (element_type *)0x0;
    local_248.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c8._0_8_ =
         "!get_opts({\"-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234\"})"
    ;
    local_c8._8_8_ = (element_type *)0xf562f5;
    local_f0[8] = false;
    local_f0._0_8_ = &PTR__lazy_ostream_01389048;
    local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
    ;
    local_4b8 = "";
    local_f0._24_8_ = (lazy_ostream *)local_c8;
    boost::test_tools::tt_detail::report_assertion
              (&local_248,(lazy_ostream *)local_f0,1,0,WARN,_cVar26,(size_t)&local_4c0,0x33f);
    boost::detail::shared_count::~shared_count(&local_248.m_message.pn);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts>
    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_kernel::ChainstateManagerOpts> *)
                        local_1c8);
    if ((_func_int **)
        local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_268.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_268.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    puVar3 = (undefined1 *)
             CONCAT17(minimum_chainwork._M_dataplus._M_p._7_1_,
                      CONCAT16(minimum_chainwork._M_dataplus._M_p._6_1_,
                               CONCAT15(minimum_chainwork._M_dataplus._M_p._5_1_,
                                        CONCAT14(minimum_chainwork._M_dataplus._M_p._4_1_,
                                                 CONCAT13(minimum_chainwork._M_dataplus._M_p._3_1_,
                                                          CONCAT12(minimum_chainwork._M_dataplus.
                                                                   _M_p._2_1_,
                                                                   CONCAT11(minimum_chainwork.
                                                                            _M_dataplus._M_p._1_1_,
                                                                            minimum_chainwork.
                                                                            _M_dataplus._M_p._0_1_))
                                                         )))));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &minimum_chainwork.field_2) {
      operator_delete(puVar3,CONCAT17(minimum_chainwork.field_2._M_local_buf[7],
                                      CONCAT16(minimum_chainwork.field_2._M_local_buf[6],
                                               CONCAT15(minimum_chainwork.field_2._M_local_buf[5],
                                                        CONCAT14(minimum_chainwork.field_2.
                                                                 _M_local_buf[4],
                                                                 CONCAT13(minimum_chainwork.field_2.
                                                                          _M_local_buf[3],
                                                                          CONCAT12(minimum_chainwork
                                                                                   .field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(minimum_chainwork.field_2._M_local_buf[1]
                                                           ,minimum_chainwork.field_2._M_local_buf
                                                            [0]))))))) + 1);
    }
    puVar3 = (undefined1 *)
             CONCAT17(assume_valid._M_dataplus._M_p._7_1_,
                      CONCAT16(assume_valid._M_dataplus._M_p._6_1_,
                               CONCAT15(assume_valid._M_dataplus._M_p._5_1_,
                                        CONCAT14(assume_valid._M_dataplus._M_p._4_1_,
                                                 CONCAT13(assume_valid._M_dataplus._M_p._3_1_,
                                                          CONCAT12(assume_valid._M_dataplus._M_p.
                                                                   _2_1_,CONCAT11(assume_valid.
                                                                                  _M_dataplus._M_p.
                                                                                  _1_1_,assume_valid
                                                                                        ._M_dataplus
                                                                                        ._M_p._0_1_)
                                                                  ))))));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &assume_valid.field_2) {
      operator_delete(puVar3,CONCAT17(assume_valid.field_2._M_local_buf[7],
                                      CONCAT16(assume_valid.field_2._M_local_buf[6],
                                               CONCAT15(assume_valid.field_2._M_local_buf[5],
                                                        CONCAT14(assume_valid.field_2._M_local_buf
                                                                 [4],CONCAT13(assume_valid.field_2.
                                                                              _M_local_buf[3],
                                                                              CONCAT12(assume_valid.
                                                                                       field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(assume_valid.field_2._M_local_buf[1],
                                                           assume_valid.field_2._M_local_buf[0])))))
                                              )) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_args, BasicTestingSetup)
{
    //! Try to apply the provided args to a ChainstateManager::Options
    auto get_opts = [&](const std::vector<const char*>& args) {
        static kernel::Notifications notifications{};
        static const ChainstateManager::Options options{
            .chainparams = ::Params(),
            .datadir = {},
            .notifications = notifications};
        return SetOptsFromArgs(*this->m_node.args, options, args);
    };
    //! Like get_opts, but requires the provided args to be valid and unwraps the result
    auto get_valid_opts = [&](const std::vector<const char*>& args) {
        const auto result{get_opts(args)};
        BOOST_REQUIRE_MESSAGE(result, util::ErrorString(result).original);
        return *result;
    };

    // test -assumevalid
    BOOST_CHECK(!get_valid_opts({}).assumed_valid_block);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid="}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-noassumevalid"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0x12"}).assumed_valid_block, uint256{0x12});

    std::string assume_valid{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-assumevalid=" + assume_valid).c_str()}).assumed_valid_block, uint256::FromHex(assume_valid));

    BOOST_CHECK(!get_opts({"-assumevalid=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-assumevalid=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars

    // test -minimumchainwork
    BOOST_CHECK(!get_valid_opts({}).minimum_chain_work);
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-nominimumchainwork"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0x1234"}).minimum_chain_work, arith_uint256{0x1234});

    std::string minimum_chainwork{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-minimumchainwork=" + minimum_chainwork).c_str()}).minimum_chain_work, UintToArith256(uint256::FromHex(minimum_chainwork).value()));

    BOOST_CHECK(!get_opts({"-minimumchainwork=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars
}